

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

bool __thiscall ON_LengthValue::Read(ON_LengthValue *this,ON_BinaryArchive *archive)

{
  undefined3 uVar1;
  uint uVar2;
  double dVar3;
  bool bVar4;
  AngleUnitSystem AVar5;
  StringFormat SVar6;
  byte bVar7;
  uint u;
  uint context_angle_unit_system_as_unsigned;
  int content_version;
  uint local_34;
  uint local_30;
  int local_2c;
  
  SVar6 = Unset.m_string_format;
  this->m_context_angle_unit_system = Unset.m_context_angle_unit_system;
  this->m_string_format = SVar6;
  this->m_context_locale_id = Unset.m_context_locale_id;
  dVar3 = Unset.m_length_unit_system.m_meters_per_custom_unit;
  uVar1 = Unset.m_length_unit_system._1_3_;
  uVar2 = Unset.m_length_unit_system.m_reserved;
  (this->m_length_unit_system).m_unit_system = Unset.m_length_unit_system.m_unit_system;
  *(undefined3 *)&(this->m_length_unit_system).field_0x1 = uVar1;
  (this->m_length_unit_system).m_reserved = uVar2;
  (this->m_length_unit_system).m_meters_per_custom_unit = dVar3;
  ON_wString::operator=
            (&(this->m_length_unit_system).m_custom_unit_name,
             &Unset.m_length_unit_system.m_custom_unit_name);
  this->m_length = Unset.m_length;
  ON_wString::operator=(&this->m_length_as_string,&Unset.m_length_as_string);
  local_2c = 0;
  bVar4 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&local_2c);
  if (!bVar4) {
    return false;
  }
  bVar4 = ON_BinaryArchive::ReadDouble(archive,&this->m_length);
  if ((bVar4) && (bVar4 = ON_UnitSystem::Read(&this->m_length_unit_system,archive), bVar4)) {
    local_30 = (uint)this->m_context_angle_unit_system;
    bVar4 = ON_BinaryArchive::ReadInt(archive,&local_30);
    if (bVar4) {
      AVar5 = ON::AngleUnitSystemFromUnsigned(local_30);
      this->m_context_angle_unit_system = AVar5;
      if ((AVar5 == Unset) || (AVar5 == None)) {
        this->m_context_angle_unit_system = Radians;
      }
      bVar4 = ON_BinaryArchive::ReadInt(archive,&this->m_context_locale_id);
      if ((bVar4) &&
         (bVar4 = ON_BinaryArchive::ReadString(archive,&this->m_length_as_string), bVar4)) {
        bVar7 = 1;
        if (local_2c < 1) goto LAB_005cb5ac;
        local_34 = (uint)this->m_string_format;
        bVar4 = ON_BinaryArchive::ReadInt(archive,&local_34);
        if (bVar4) {
          SVar6 = LengthStringFormatFromUnsigned(local_34);
          this->m_string_format = SVar6;
          goto LAB_005cb5ac;
        }
      }
    }
  }
  bVar7 = 0;
LAB_005cb5ac:
  bVar4 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar4 & bVar7);
}

Assistant:

bool ON_LengthValue::Read(
  class ON_BinaryArchive& archive
)
{
  *this = ON_LengthValue::Unset;

  int content_version = 0;
  if (!archive.BeginRead3dmAnonymousChunk(&content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!archive.ReadDouble(&m_length))
      break;
    if (!m_length_unit_system.Read(archive))
      break;

    unsigned int context_angle_unit_system_as_unsigned = static_cast<unsigned int>(m_context_angle_unit_system);
    if (!archive.ReadInt(&context_angle_unit_system_as_unsigned))
      break;
    m_context_angle_unit_system = ON::AngleUnitSystemFromUnsigned(context_angle_unit_system_as_unsigned);
    if (ON::AngleUnitSystem::None == m_context_angle_unit_system || ON::AngleUnitSystem::Unset == m_context_angle_unit_system)
      m_context_angle_unit_system = ON::AngleUnitSystem::Radians;
    if (!archive.ReadInt(&m_context_locale_id))
      break;

    if (!archive.ReadString(m_length_as_string))
      break;

    if (content_version >= 1)
    {
      // content version 1 added m_string_format
      unsigned int u = static_cast<unsigned char>(m_string_format);
      if (!archive.ReadInt(&u))
        break;
      m_string_format = ON_LengthValue::LengthStringFormatFromUnsigned(u);
    }

    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}